

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setBoolParam(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,BoolParam param,bool value,bool init)

{
  bool bVar1;
  Verbosity VVar2;
  byte in_CL;
  bool bVar3;
  byte in_DL;
  BoolParam in_ESI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  SPxOut *in_stack_ffffffffffffff70;
  SPxOut *this_00;
  Verbosity local_54;
  Verbosity local_50 [4];
  string local_40 [32];
  Verbosity local_20;
  Verbosity local_1c;
  byte local_16;
  byte local_15;
  BoolParam local_14;
  
  bVar3 = (bool)(in_DL & 1);
  local_16 = in_CL & 1;
  local_15 = bVar3;
  local_14 = in_ESI;
  if ((local_16 != 0) || (bVar1 = boolParam(in_RDI,in_ESI), bVar3 != bVar1)) {
    switch(local_14) {
    case LIFTING:
      break;
    case EQTRANS:
      break;
    case TESTDUALINF:
      break;
    case RATFAC:
      break;
    case ACCEPTCYCLING:
      break;
    case RATREC:
      break;
    case POWERSCALING:
      break;
    case RATFACJUMP:
      break;
    case ROWBOUNDFLIPS:
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::useBoundFlipsRow(&in_RDI->_ratiotesterBoundFlipping,(bool)(local_15 & 1));
      break;
    case PERSISTENTSCALING:
      break;
    case FULLPERTURBATION:
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::useFullPerturbation(&in_RDI->_solver,(bool)(local_15 & 1));
      break;
    case ENSURERAY:
      break;
    case FORCEBASIC:
      break;
    case SIMPLIFIER_SINGLETONCOLS:
    case SIMPLIFIER_CONSTRAINTPROPAGATION:
    case SIMPLIFIER_PARALLELROWDETECTION:
    case SIMPLIFIER_PARALLELCOLDETECTION:
    case SIMPLIFIER_SINGLETONSTUFFING:
    case SIMPLIFIER_DUALFIX:
    case SIMPLIFIER_FIXCONTINUOUS:
    case SIMPLIFIER_DOMINATEDCOLS:
      if ((in_RDI->_currentSettings->_boolParamValues[local_14] & 1U) != (local_15 & 1)) {
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
          this_00 = &in_RDI->spxout;
          local_1c = SPxOut::getVerbosity(this_00);
          local_20 = INFO1;
          SPxOut::setVerbosity(this_00,&local_20);
          soplex::operator<<(this_00,(char *)in_stack_ffffffffffffff68);
          std::__cxx11::string::string
                    (local_40,(string *)
                              (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               ::Settings::boolParam + (ulong)local_14 * 0x20));
          soplex::operator<<(this_00,in_stack_ffffffffffffff68);
          soplex::operator<<(this_00,(char *)in_stack_ffffffffffffff68);
          std::__cxx11::string::~string(local_40);
          SPxOut::setVerbosity(&in_RDI->spxout,&local_1c);
        }
        return false;
      }
      break;
    case ITERATIVE_REFINEMENT:
      break;
    case ADAPT_TOLS_TO_MULTIPRECISION:
      break;
    case PRECISION_BOOSTING:
      if ((in_RDI->_currentSettings->_boolParamValues[local_14] & 1U) != (local_15 & 1)) {
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
          local_50[0] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_54 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_54);
          soplex::operator<<(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
          SPxOut::setVerbosity(&in_RDI->spxout,local_50);
        }
        return false;
      }
      break;
    case BOOSTED_WARM_START:
      break;
    case RECOVERY_MECHANISM:
      break;
    default:
      return false;
    }
    in_RDI->_currentSettings->_boolParamValues[local_14] = (bool)(local_15 & 1);
  }
  return true;
}

Assistant:

bool SoPlexBase<R>::setBoolParam(const BoolParam param, const bool value, const bool init)
{
   assert(param >= 0);
   assert(param < SoPlexBase<R>::BOOLPARAM_COUNT);
   assert(init || _isConsistent());

   if(!init && value == boolParam(param))
      return true;

   switch(param)
   {
   case LIFTING:
      break;

   case EQTRANS:
      break;

   case TESTDUALINF:
      break;

   case RATFAC:
      break;

   case ACCEPTCYCLING:
      break;

   case RATREC:
      break;

   case POWERSCALING:
      break;

   case RATFACJUMP:
      break;

   case ROWBOUNDFLIPS:
      _ratiotesterBoundFlipping.useBoundFlipsRow(value);
      break;

   case PERSISTENTSCALING:
      break;

   case FULLPERTURBATION:
      _solver.useFullPerturbation(value);
      break;

   case ENSURERAY:
      break;

   case FORCEBASIC:
      break;

#ifdef SOPLEX_WITH_PAPILO

   case SIMPLIFIER_SINGLETONCOLS:
      _simplifierPaPILO.setEnableSingletonCols(value);
      break;

   case SIMPLIFIER_CONSTRAINTPROPAGATION:
      _simplifierPaPILO.setEnablePropagation(value);
      break;

   case SIMPLIFIER_PARALLELROWDETECTION:
      _simplifierPaPILO.setEnableParallelRows(value);
      break;

   case SIMPLIFIER_PARALLELCOLDETECTION:
      _simplifierPaPILO.setEnableParallelCols(value);
      break;

   case SIMPLIFIER_SINGLETONSTUFFING:
      _simplifierPaPILO.setEnableStuffing(value);
      break;

   case SIMPLIFIER_DUALFIX:
      _simplifierPaPILO.setEnableDualFix(value);
      break;

   case SIMPLIFIER_FIXCONTINUOUS:
      _simplifierPaPILO.setEnableFixContinuous(value);
      break;

   case SIMPLIFIER_DOMINATEDCOLS:
      _simplifierPaPILO.setEnableDomCols(value);
      break;
#else

   case SIMPLIFIER_SINGLETONCOLS:
   case SIMPLIFIER_CONSTRAINTPROPAGATION:
   case SIMPLIFIER_PARALLELROWDETECTION:
   case SIMPLIFIER_PARALLELCOLDETECTION:
   case SIMPLIFIER_SINGLETONSTUFFING:
   case SIMPLIFIER_DUALFIX:
   case SIMPLIFIER_FIXCONTINUOUS:
   case SIMPLIFIER_DOMINATEDCOLS:
      if(_currentSettings->_boolParamValues[param] != value)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Changing Parameter " << _currentSettings->boolParam.name[param] <<
                       " is only possible if SoPlex is build with PaPILO\n");
         return false;
      }

      break;
#endif

   case ITERATIVE_REFINEMENT:
      break;

   case ADAPT_TOLS_TO_MULTIPRECISION:
      break;

   case PRECISION_BOOSTING:
#ifndef SOPLEX_WITH_MPFR
      if(_currentSettings->_boolParamValues[param] != value)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Changing Parameter precision_boosting is only possible if SoPlex is build with MPFR\n");
         return false;
      }

#endif
      break;

   case BOOSTED_WARM_START:
      break;

   case RECOVERY_MECHANISM:
      break;

   default:
      return false;
   }

   _currentSettings->_boolParamValues[param] = value;
   return true;
}